

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O0

void ThrottlingSum::Register(Connection *con)

{
  TableFunction TVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  type pCVar3;
  LogicalType *this;
  CreateTableFunctionInfo caching_table_in_out_info;
  TableFunction caching_table_in_out;
  Catalog *catalog;
  ClientContext *client_context;
  allocator_type *in_stack_fffffffffffff9b8;
  code *pcVar4;
  TableFunction *in_stack_fffffffffffff9c0;
  TableFunction *in_stack_fffffffffffff9c8;
  TableFunction *in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d8 [24];
  undefined8 in_stack_fffffffffffff9f0;
  undefined8 in_stack_fffffffffffff9f8;
  ClientContext *pCVar5;
  undefined8 in_stack_fffffffffffffa00;
  LogicalType *pLVar6;
  LogicalType *pLVar7;
  undefined1 *puVar8;
  allocator *paVar9;
  undefined8 in_stack_fffffffffffffa30;
  undefined1 in_stack_fffffffffffffa38 [312];
  CreateTableFunctionInfo local_410 [447];
  undefined1 local_251;
  LogicalType *local_250;
  LogicalType local_248 [24];
  LogicalType *local_230;
  undefined8 local_228;
  undefined1 local_220 [47];
  allocator local_1f1;
  string local_1f0 [32];
  TableFunction local_1d0;
  ClientContext *local_18;
  type local_10;
  
  duckdb::Connection::BeginTransaction();
  local_10 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                       ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffff9c0);
  local_18 = (ClientContext *)duckdb::Catalog::GetSystemCatalog(local_10);
  paVar9 = &local_1f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,"throttling_sum",paVar9);
  local_250 = local_248;
  duckdb::LogicalType::LogicalType(local_250,TABLE);
  local_230 = local_248;
  local_228 = 1;
  puVar8 = &local_251;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x74a72d);
  iVar2._M_len = (size_type)in_stack_fffffffffffff9d0;
  iVar2._M_array = (iterator)in_stack_fffffffffffff9c8;
  duckdb::vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff9c0,iVar2,
             in_stack_fffffffffffff9b8);
  pcVar4 = ThrottlingSumLocalInit;
  duckdb::TableFunction::TableFunction
            (&local_1d0,local_1f0,local_220,0,Bind,ThrottlingSumGlobalInit);
  duckdb::vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x74a79c);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x74a7a9);
  pLVar6 = local_248;
  this = (LogicalType *)&local_230;
  do {
    this = this + -0x18;
    duckdb::LogicalType::~LogicalType(this);
  } while (this != pLVar6);
  pLVar7 = this;
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  local_1d0.in_out_function = Function;
  local_1d0.in_out_function_final = Finalize;
  duckdb::TableFunction::TableFunction(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  TVar1._8_8_ = in_stack_fffffffffffff9c0;
  TVar1._0_8_ = pcVar4;
  TVar1._16_8_ = in_stack_fffffffffffff9c8;
  TVar1._24_8_ = in_stack_fffffffffffff9d0;
  TVar1._32_24_ = in_stack_fffffffffffff9d8;
  TVar1._56_8_ = in_stack_fffffffffffff9f0;
  TVar1._64_8_ = in_stack_fffffffffffff9f8;
  TVar1._72_8_ = in_stack_fffffffffffffa00;
  TVar1._80_8_ = this;
  TVar1._88_8_ = pLVar6;
  TVar1._96_8_ = pLVar7;
  TVar1._104_8_ = puVar8;
  TVar1._112_8_ = paVar9;
  TVar1._120_8_ = in_stack_fffffffffffffa30;
  TVar1._128_312_ = in_stack_fffffffffffffa38;
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo(local_410,TVar1);
  duckdb::TableFunction::~TableFunction(in_stack_fffffffffffff9c0);
  pCVar5 = local_18;
  pCVar3 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffff9c0);
  duckdb::Catalog::CreateTableFunction(pCVar5,(CreateTableFunctionInfo *)pCVar3);
  duckdb::Connection::Commit();
  duckdb::CreateTableFunctionInfo::~CreateTableFunctionInfo
            ((CreateTableFunctionInfo *)in_stack_fffffffffffff9c0);
  duckdb::TableFunction::~TableFunction(in_stack_fffffffffffff9c0);
  return;
}

Assistant:

static void Register(Connection &con) {
		// Create our test TableFunction
		con.BeginTransaction();
		auto &client_context = *con.context;
		auto &catalog = Catalog::GetSystemCatalog(client_context);
		TableFunction caching_table_in_out("throttling_sum", {LogicalType::TABLE}, nullptr, ThrottlingSum::Bind,
		                                   ThrottlingSum::ThrottlingSumGlobalInit,
		                                   ThrottlingSum::ThrottlingSumLocalInit);
		caching_table_in_out.in_out_function = ThrottlingSum::Function;
		caching_table_in_out.in_out_function_final = ThrottlingSum::Finalize;
		CreateTableFunctionInfo caching_table_in_out_info(caching_table_in_out);
		catalog.CreateTableFunction(*con.context, caching_table_in_out_info);
		con.Commit();
	}